

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

aom_codec_err_t
av1_copy_new_frame_enc(AV1_COMMON *cm,YV12_BUFFER_CONFIG *new_frame,YV12_BUFFER_CONFIG *sd)

{
  if ((((((new_frame->field_1).field_0.y_height == (sd->field_1).field_0.y_height) &&
        ((new_frame->field_0).field_0.y_width == (sd->field_0).field_0.y_width)) &&
       ((new_frame->field_1).field_0.uv_height == (sd->field_1).field_0.uv_height)) &&
      (((new_frame->field_0).field_0.uv_width == (sd->field_0).field_0.uv_width &&
       ((new_frame->field_4).field_0.y_stride == (sd->field_4).field_0.y_stride)))) &&
     (((new_frame->field_4).field_0.uv_stride == (sd->field_4).field_0.uv_stride &&
      ((new_frame->border == sd->border && (((sd->flags ^ new_frame->flags) & 8U) == 0)))))) {
    aom_yv12_copy_frame_c(new_frame,sd,(uint)(cm->seq_params->monochrome == '\0') * 2 + 1);
  }
  else {
    aom_internal_error(cm->error,AOM_CODEC_ERROR,"Incorrect buffer dimensions");
  }
  return cm->error->error_code;
}

Assistant:

aom_codec_err_t av1_copy_new_frame_enc(AV1_COMMON *cm,
                                       YV12_BUFFER_CONFIG *new_frame,
                                       YV12_BUFFER_CONFIG *sd) {
  const int num_planes = av1_num_planes(cm);
  if (!equal_dimensions_and_border(new_frame, sd))
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "Incorrect buffer dimensions");
  else
    aom_yv12_copy_frame(new_frame, sd, num_planes);

  return cm->error->error_code;
}